

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall backward::Colorize::activate(Colorize *this,type mode,FILE *fp)

{
  FILE *in_RDX;
  undefined4 in_ESI;
  undefined4 in_stack_fffffffffffffff0;
  
  fileno(in_RDX);
  activate((Colorize *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(type)((ulong)in_RDX >> 0x20),
           (int)in_RDX);
  return;
}

Assistant:

void activate(ColorMode::type mode, FILE *fp) { activate(mode, fileno(fp)); }